

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_bitmap_contains(roaring64_bitmap_t *r,uint64_t val)

{
  art_val_t *paVar1;
  container_t *c;
  leaf_t *leaf;
  uint16_t low16;
  uint8_t high48 [6];
  art_t *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  undefined1 local_1;
  
  split_key(CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
            (uint8_t *)in_stack_ffffffffffffffc8);
  paVar1 = art_find(in_stack_ffffffffffffffc8,(art_key_chunk_t *)0x11d2c1);
  if (paVar1 == (art_val_t *)0x0) {
    local_1 = false;
  }
  else {
    c = get_container((roaring64_bitmap_t *)
                      CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                      (leaf_t)in_stack_ffffffffffffffc8);
    get_typecode(*paVar1);
    local_1 = container_contains(c,0,'\0');
  }
  return local_1;
}

Assistant:

bool roaring64_bitmap_contains(const roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = (leaf_t *)art_find(&r->art, high48);
    if (leaf != NULL) {
        return container_contains(get_container(r, *leaf), low16,
                                  get_typecode(*leaf));
    }
    return false;
}